

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
DependencyScan::RecomputeNodeDirty
          (DependencyScan *this,Node *node,vector<Node_*,_std::allocator<Node_*>_> *stack,
          vector<Node_*,_std::allocator<Node_*>_> *validation_nodes,string *err)

{
  pointer *pppNVar1;
  Edge *edge;
  iterator __position;
  Edge *pEVar2;
  pointer ppNVar3;
  bool bVar4;
  bool bVar5;
  pointer ppNVar6;
  pointer ppNVar7;
  Node *pNVar8;
  pointer ppNVar9;
  string *err_00;
  Node *pNVar10;
  bool local_51;
  DependencyScan *local_50;
  vector<Node*,std::allocator<Node*>> *local_48;
  vector<Node_*,_std::allocator<Node_*>_> *local_40;
  Node *local_38;
  
  edge = node->in_edge_;
  local_50 = this;
  local_48 = (vector<Node*,std::allocator<Node*>> *)validation_nodes;
  local_38 = node;
  if (edge == (Edge *)0x0) {
    if (node->exists_ != ExistenceStatusUnknown) {
      return true;
    }
    bVar4 = Node::Stat(node,this->disk_interface_,err);
    if (!bVar4) {
      return false;
    }
    if (node->exists_ == ExistenceStatusExists) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (g_explaining == true) {
        fprintf(_stderr,"ninja explain: %s has no in-edge and is missing\n",
                (node->path_)._M_dataplus._M_p);
        bVar4 = node->exists_ != ExistenceStatusExists;
      }
    }
    node->dirty_ = bVar4;
    return true;
  }
  if (edge->mark_ == VisitDone) {
    return true;
  }
  err_00 = err;
  bVar4 = VerifyDAG(this,node,stack,err);
  if (!bVar4) {
    return false;
  }
  edge->mark_ = VisitInStack;
  __position._M_current =
       (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)stack,__position,&local_38);
  }
  else {
    *__position._M_current = node;
    pppNVar1 = &(stack->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;
  if (((edge->deps_loaded_ == false) && (pNVar8 = edge->dyndep_, pNVar8 != (Node *)0x0)) &&
     (pNVar8->dyndep_pending_ == true)) {
    err_00 = err;
    bVar4 = RecomputeNodeDirty(local_50,pNVar8,stack,
                               (vector<Node_*,_std::allocator<Node_*>_> *)local_48,err);
    if (!bVar4) {
      return false;
    }
    pEVar2 = edge->dyndep_->in_edge_;
    if (((pEVar2 == (Edge *)0x0) || (pEVar2->outputs_ready_ == true)) &&
       (bVar4 = DyndepLoader::LoadDyndeps(&local_50->dyndep_loader_,edge->dyndep_,err), !bVar4)) {
      return false;
    }
  }
  ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar6; ppNVar9 = ppNVar9 + 1) {
    if ((*ppNVar9)->exists_ == ExistenceStatusUnknown) {
      bVar4 = Node::Stat(*ppNVar9,local_50->disk_interface_,err);
      if (!bVar4) {
        return false;
      }
      ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  if (edge->deps_loaded_ == false) {
    edge->deps_loaded_ = true;
    bVar4 = ImplicitDepLoader::LoadDeps(&local_50->dep_loader_,edge,err);
    if (!bVar4) {
      if (err->_M_string_length != 0) {
        return false;
      }
      edge->deps_missing_ = true;
      bVar4 = true;
      goto LAB_0011494d;
    }
  }
  bVar4 = false;
LAB_0011494d:
  local_40 = stack;
  std::vector<Node*,std::allocator<Node*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>>
            (local_48,*(undefined8 *)(local_48 + 8),
             (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (edge->validations_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ppNVar9 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar9 ==
      (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar8 = (Node *)0x0;
  }
  else {
    ppNVar6 = ppNVar9;
    pNVar10 = (Node *)0x0;
    do {
      err_00 = err;
      bVar5 = RecomputeNodeDirty(local_50,*ppNVar6,local_40,
                                 (vector<Node_*,_std::allocator<Node_*>_> *)local_48,err);
      if (!bVar5) {
        return false;
      }
      pNVar8 = *ppNVar6;
      if ((pNVar8->in_edge_ != (Edge *)0x0) && (pNVar8->in_edge_->outputs_ready_ == false)) {
        edge->outputs_ready_ = false;
      }
      ppNVar3 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar7 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppNVar9 - (long)ppNVar3 >> 3) <
          (ulong)(((long)ppNVar7 - (long)ppNVar3 >> 3) - (long)edge->order_only_deps_)) {
        if (pNVar8->dirty_ == true) {
          bVar4 = true;
          if (g_explaining == true) {
            fprintf(_stderr,"ninja explain: %s is dirty\n",(pNVar8->path_)._M_dataplus._M_p);
            ppNVar7 = (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          goto LAB_00114a27;
        }
        if ((pNVar10 != (Node *)0x0) && (pNVar8->mtime_ <= pNVar10->mtime_)) goto LAB_00114a27;
      }
      else {
LAB_00114a27:
        pNVar8 = pNVar10;
      }
      ppNVar6 = ppNVar6 + 1;
      ppNVar9 = ppNVar9 + 1;
      pNVar10 = pNVar8;
    } while (ppNVar6 != ppNVar7);
  }
  local_51 = bVar4;
  if (bVar4 == false) {
    RecomputeOutputsDirty(local_50,edge,pNVar8,&local_51,err_00);
  }
  ppNVar6 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar6; ppNVar9 = ppNVar9 + 1) {
    if ((local_51 & 1U) != 0) {
      (*ppNVar9)->dirty_ = true;
    }
  }
  if (((local_51 & 1U) != 0) &&
     ((edge->rule_ != &State::kPhonyRule ||
      ((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish)))) {
    edge->outputs_ready_ = false;
  }
  edge->mark_ = VisitDone;
  ppNVar9 = (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar9[-1] != local_38) {
    __assert_fail("stack->back() == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph.cc",
                  0xdc,
                  "bool DependencyScan::RecomputeNodeDirty(Node *, std::vector<Node *> *, std::vector<Node *> *, string *)"
                 );
  }
  (local_40->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = ppNVar9 + -1;
  return true;
}

Assistant:

bool DependencyScan::RecomputeNodeDirty(Node* node, std::vector<Node*>* stack,
                                        std::vector<Node*>* validation_nodes,
                                        string* err) {
  Edge* edge = node->in_edge();
  if (!edge) {
    // If we already visited this leaf node then we are done.
    if (node->status_known())
      return true;
    // This node has no in-edge; it is dirty if it is missing.
    if (!node->StatIfNecessary(disk_interface_, err))
      return false;
    if (!node->exists())
      EXPLAIN("%s has no in-edge and is missing", node->path().c_str());
    node->set_dirty(!node->exists());
    return true;
  }

  // If we already finished this edge then we are done.
  if (edge->mark_ == Edge::VisitDone)
    return true;

  // If we encountered this edge earlier in the call stack we have a cycle.
  if (!VerifyDAG(node, stack, err))
    return false;

  // Mark the edge temporarily while in the call stack.
  edge->mark_ = Edge::VisitInStack;
  stack->push_back(node);

  bool dirty = false;
  edge->outputs_ready_ = true;
  edge->deps_missing_ = false;

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.
    // If there is a pending dyndep file, visit it now:
    // * If the dyndep file is ready then load it now to get any
    //   additional inputs and outputs for this and other edges.
    //   Once the dyndep file is loaded it will no longer be pending
    //   if any other edges encounter it, but they will already have
    //   been updated.
    // * If the dyndep file is not ready then since is known to be an
    //   input to this edge, the edge will not be considered ready below.
    //   Later during the build the dyndep file will become ready and be
    //   loaded to update this edge before it can possibly be scheduled.
    if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
      if (!RecomputeNodeDirty(edge->dyndep_, stack, validation_nodes, err))
        return false;

      if (!edge->dyndep_->in_edge() ||
          edge->dyndep_->in_edge()->outputs_ready()) {
        // The dyndep file is ready, so load it now.
        if (!LoadDyndeps(edge->dyndep_, err))
          return false;
      }
    }
  }

  // Load output mtimes so we can compare them to the most recent input below.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!(*o)->StatIfNecessary(disk_interface_, err))
      return false;
  }

  if (!edge->deps_loaded_) {
    // This is our first encounter with this edge.  Load discovered deps.
    edge->deps_loaded_ = true;
    if (!dep_loader_.LoadDeps(edge, err)) {
      if (!err->empty())
        return false;
      // Failed to load dependency info: rebuild to regenerate it.
      // LoadDeps() did EXPLAIN() already, no need to do it here.
      dirty = edge->deps_missing_ = true;
    }
  }

  // Store any validation nodes from the edge for adding to the initial
  // nodes.  Don't recurse into them, that would trigger the dependency
  // cycle detector if the validation node depends on this node.
  // RecomputeDirty will add the validation nodes to the initial nodes
  // and recurse into them.
  validation_nodes->insert(validation_nodes->end(),
      edge->validations_.begin(), edge->validations_.end());

  // Visit all inputs; we're dirty if any of the inputs are dirty.
  Node* most_recent_input = NULL;
  for (vector<Node*>::iterator i = edge->inputs_.begin();
       i != edge->inputs_.end(); ++i) {
    // Visit this input.
    if (!RecomputeNodeDirty(*i, stack, validation_nodes, err))
      return false;

    // If an input is not ready, neither are our outputs.
    if (Edge* in_edge = (*i)->in_edge()) {
      if (!in_edge->outputs_ready_)
        edge->outputs_ready_ = false;
    }

    if (!edge->is_order_only(i - edge->inputs_.begin())) {
      // If a regular input is dirty (or missing), we're dirty.
      // Otherwise consider mtime.
      if ((*i)->dirty()) {
        EXPLAIN("%s is dirty", (*i)->path().c_str());
        dirty = true;
      } else {
        if (!most_recent_input || (*i)->mtime() > most_recent_input->mtime()) {
          most_recent_input = *i;
        }
      }
    }
  }

  // We may also be dirty due to output state: missing outputs, out of
  // date outputs, etc.  Visit all outputs and determine whether they're dirty.
  if (!dirty)
    if (!RecomputeOutputsDirty(edge, most_recent_input, &dirty, err))
      return false;

  // Finally, visit each output and update their dirty state if necessary.
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (dirty)
      (*o)->MarkDirty();
  }

  // If an edge is dirty, its outputs are normally not ready.  (It's
  // possible to be clean but still not be ready in the presence of
  // order-only inputs.)
  // But phony edges with no inputs have nothing to do, so are always
  // ready.
  if (dirty && !(edge->is_phony() && edge->inputs_.empty()))
    edge->outputs_ready_ = false;

  // Mark the edge as finished during this walk now that it will no longer
  // be in the call stack.
  edge->mark_ = Edge::VisitDone;
  assert(stack->back() == node);
  stack->pop_back();

  return true;
}